

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int rtreeDeleteRowid(Rtree *pRtree,sqlite3_int64 iDelete)

{
  RtreeNode *pNode;
  ushort uVar1;
  int iVar2;
  int iVar3;
  i64 iNode;
  RtreeNode *pRVar4;
  uint uVar5;
  long in_FS_OFFSET;
  bool bVar6;
  RtreeNode *pRoot;
  int iCell;
  RtreeNode *pInsert;
  RtreeNode *pChild;
  RtreeNode *local_88;
  int local_7c;
  RtreeNode *local_78;
  RtreeNode *local_70;
  RtreeCell local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_78 = (RtreeNode *)0x0;
  local_7c = -0x55555556;
  local_88 = (RtreeNode *)0x0;
  iVar2 = nodeAcquire(pRtree,1,(RtreeNode *)0x0,&local_88);
  if (iVar2 == 0) {
    iVar2 = findLeafNode(pRtree,iDelete,&local_78,(sqlite3_int64 *)0x0);
  }
  pRVar4 = local_78;
  if (local_78 != (RtreeNode *)0x0 && iVar2 == 0) {
    iVar3 = nodeRowidIndex(pRtree,local_78,iDelete,&local_7c);
    if (iVar3 == 0) {
      iVar3 = deleteCell(pRtree,pRVar4,local_7c,0);
    }
    iVar2 = nodeRelease(pRtree,pRVar4);
    if (iVar3 != 0) {
      iVar2 = iVar3;
    }
  }
  if (iVar2 == 0) {
    sqlite3_bind_int64(pRtree->pDeleteRowid,1,iDelete);
    sqlite3_step(pRtree->pDeleteRowid);
    iVar2 = sqlite3_reset(pRtree->pDeleteRowid);
  }
  pRVar4 = local_88;
  if (((iVar2 == 0) && (iVar2 = 0, 0 < pRtree->iDepth)) &&
     (uVar1 = *(ushort *)(local_88->zData + 2), (ushort)(uVar1 << 8 | uVar1 >> 8) == 1)) {
    local_68.iRowid = 0;
    iNode = readInt64(local_88->zData + 4);
    iVar3 = nodeAcquire(pRtree,iNode,pRVar4,(RtreeNode **)&local_68);
    if (iVar3 == 0) {
      iVar3 = removeNode(pRtree,(RtreeNode *)local_68.iRowid,pRtree->iDepth + -1);
    }
    iVar2 = nodeRelease(pRtree,(RtreeNode *)local_68.iRowid);
    if (iVar3 != 0) {
      iVar2 = iVar3;
    }
    if (iVar2 == 0) {
      iVar3 = pRtree->iDepth + -1;
      pRtree->iDepth = iVar3;
      uVar1 = (ushort)iVar3;
      *(ushort *)pRVar4->zData = uVar1 << 8 | uVar1 >> 8;
      pRVar4->isDirty = 1;
    }
  }
  pRVar4 = pRtree->pDeleted;
  if (pRVar4 != (RtreeNode *)0x0) {
    do {
      if (iVar2 == 0) {
        uVar1 = *(ushort *)(pRVar4->zData + 2) << 8 | *(ushort *)(pRVar4->zData + 2) >> 8;
        if (uVar1 == 0) {
          iVar2 = 0;
        }
        else {
          uVar5 = 1;
          do {
            local_70 = (RtreeNode *)&DAT_aaaaaaaaaaaaaaaa;
            local_68.iRowid = (i64)&DAT_aaaaaaaaaaaaaaaa;
            local_68.aCoord[4].i = -1;
            local_68.aCoord[5].i = -1;
            local_68.aCoord[6].i = -1;
            local_68.aCoord[7].i = -1;
            local_68.aCoord[0].i = -1;
            local_68.aCoord[1].i = -1;
            local_68.aCoord[2].i = -1;
            local_68.aCoord[3].i = -1;
            local_68.aCoord[8] = (RtreeCoord)0xffffffff;
            local_68.aCoord[9] = (RtreeCoord)0xffffffff;
            nodeGetCell(pRtree,pRVar4,uVar5 - 1,&local_68);
            iVar2 = ChooseLeaf(pRtree,&local_68,(int)pRVar4->iNode,&local_70);
            pNode = local_70;
            if (iVar2 == 0) {
              iVar3 = rtreeInsertCell(pRtree,local_70,&local_68,(int)pRVar4->iNode);
              iVar2 = nodeRelease(pRtree,pNode);
              if (iVar3 != 0) {
                iVar2 = iVar3;
              }
            }
          } while ((iVar2 == 0) && (bVar6 = uVar5 < uVar1, uVar5 = uVar5 + 1, bVar6));
        }
      }
      pRtree->pDeleted = pRVar4->pNext;
      pRtree->nNodeRef = pRtree->nNodeRef - 1;
      sqlite3_free(pRVar4);
      pRVar4 = pRtree->pDeleted;
    } while (pRVar4 != (RtreeNode *)0x0);
    pRVar4 = (RtreeNode *)0x0;
  }
  local_78 = pRVar4;
  iVar3 = nodeRelease(pRtree,local_88);
  if (iVar2 != 0) {
    iVar3 = iVar2;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar3;
}

Assistant:

static int rtreeDeleteRowid(Rtree *pRtree, sqlite3_int64 iDelete){
  int rc;                         /* Return code */
  RtreeNode *pLeaf = 0;           /* Leaf node containing record iDelete */
  int iCell;                      /* Index of iDelete cell in pLeaf */
  RtreeNode *pRoot = 0;           /* Root node of rtree structure */


  /* Obtain a reference to the root node to initialize Rtree.iDepth */
  rc = nodeAcquire(pRtree, 1, 0, &pRoot);

  /* Obtain a reference to the leaf node that contains the entry
  ** about to be deleted.
  */
  if( rc==SQLITE_OK ){
    rc = findLeafNode(pRtree, iDelete, &pLeaf, 0);
  }

#ifdef CORRUPT_DB
  assert( pLeaf!=0 || rc!=SQLITE_OK || CORRUPT_DB );
#endif

  /* Delete the cell in question from the leaf node. */
  if( rc==SQLITE_OK && pLeaf ){
    int rc2;
    rc = nodeRowidIndex(pRtree, pLeaf, iDelete, &iCell);
    if( rc==SQLITE_OK ){
      rc = deleteCell(pRtree, pLeaf, iCell, 0);
    }
    rc2 = nodeRelease(pRtree, pLeaf);
    if( rc==SQLITE_OK ){
      rc = rc2;
    }
  }

  /* Delete the corresponding entry in the <rtree>_rowid table. */
  if( rc==SQLITE_OK ){
    sqlite3_bind_int64(pRtree->pDeleteRowid, 1, iDelete);
    sqlite3_step(pRtree->pDeleteRowid);
    rc = sqlite3_reset(pRtree->pDeleteRowid);
  }

  /* Check if the root node now has exactly one child. If so, remove
  ** it, schedule the contents of the child for reinsertion and
  ** reduce the tree height by one.
  **
  ** This is equivalent to copying the contents of the child into
  ** the root node (the operation that Gutman's paper says to perform
  ** in this scenario).
  */
  if( rc==SQLITE_OK && pRtree->iDepth>0 && NCELL(pRoot)==1 ){
    int rc2;
    RtreeNode *pChild = 0;
    i64 iChild = nodeGetRowid(pRtree, pRoot, 0);
    rc = nodeAcquire(pRtree, iChild, pRoot, &pChild);  /* tag-20210916a */
    if( rc==SQLITE_OK ){
      rc = removeNode(pRtree, pChild, pRtree->iDepth-1);
    }
    rc2 = nodeRelease(pRtree, pChild);
    if( rc==SQLITE_OK ) rc = rc2;
    if( rc==SQLITE_OK ){
      pRtree->iDepth--;
      writeInt16(pRoot->zData, pRtree->iDepth);
      pRoot->isDirty = 1;
    }
  }

  /* Re-insert the contents of any underfull nodes removed from the tree. */
  for(pLeaf=pRtree->pDeleted; pLeaf; pLeaf=pRtree->pDeleted){
    if( rc==SQLITE_OK ){
      rc = reinsertNodeContent(pRtree, pLeaf);
    }
    pRtree->pDeleted = pLeaf->pNext;
    pRtree->nNodeRef--;
    sqlite3_free(pLeaf);
  }

  /* Release the reference to the root node. */
  if( rc==SQLITE_OK ){
    rc = nodeRelease(pRtree, pRoot);
  }else{
    nodeRelease(pRtree, pRoot);
  }

  return rc;
}